

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

double TTA::Alloc(uint max_length,PerformanceEvaluator *perf)

{
  double dVar1;
  long lVar2;
  uint *__s;
  uint *__s_00;
  uint *__s_01;
  ulong __n;
  double dVar3;
  double dVar4;
  
  lVar2 = cv::getTickCount();
  (perf->counter_).last = (double)lVar2;
  __n = (ulong)max_length << 2;
  __s = (uint *)operator_new__(__n);
  rtable_ = __s;
  __s_00 = (uint *)operator_new__(__n);
  next_ = __s_00;
  __s_01 = (uint *)operator_new__(__n);
  tail_ = __s_01;
  memset(__s,0,__n);
  memset(__s_00,0,__n);
  memset(__s_01,0,__n);
  lVar2 = cv::getTickCount();
  dVar3 = (double)lVar2 - (perf->counter_).last;
  (perf->counter_).last = dVar3;
  (perf->counter_).total = (perf->counter_).total + dVar3;
  dVar1 = perf->tick_frequency_;
  lVar2 = cv::getTickCount();
  (perf->counter_).last = (double)lVar2;
  memset(rtable_,0,__n);
  memset(next_,0,__n);
  memset(tail_,0,__n);
  lVar2 = cv::getTickCount();
  dVar4 = (double)lVar2 - (perf->counter_).last;
  (perf->counter_).last = dVar4;
  (perf->counter_).total = (perf->counter_).total + dVar4;
  return (dVar3 * 1000.0) / dVar1 - (dVar4 * 1000.0) / perf->tick_frequency_;
}

Assistant:

static double Alloc(unsigned max_length, PerformanceEvaluator& perf) {
        perf.start();
        rtable_ = new unsigned[max_length];
        next_ = new unsigned[max_length];
        tail_ = new unsigned[max_length];
        memset(rtable_, 0, max_length * sizeof(unsigned));
        memset(next_, 0, max_length * sizeof(unsigned));
        memset(tail_, 0, max_length * sizeof(unsigned));
        perf.stop();
        double t = perf.last();
        perf.start();
        memset(rtable_, 0, max_length * sizeof(unsigned));
        memset(next_, 0, max_length * sizeof(unsigned));
        memset(tail_, 0, max_length * sizeof(unsigned));
        perf.stop();
        return t - perf.last();
    }